

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitrate.c
# Opt level: O0

int vorbis_bitrate_addblock(vorbis_block *vb)

{
  void *pvVar1;
  void *pvVar2;
  vorbis_info *pvVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  long local_d8;
  long local_c8;
  long local_c0;
  long local_b8;
  long avg_target_bits_1;
  long minsize;
  long maxsize;
  double slewlimit;
  long avg_target_bits;
  double slew;
  long desired_fill;
  int samples;
  long max_target_bits;
  long min_target_bits;
  long this_bits;
  int choice;
  bitrate_manager_info *bi;
  codec_setup_info *ci;
  vorbis_info *vi;
  bitrate_manager_state *bm;
  private_state *b;
  vorbis_dsp_state *vd;
  vorbis_block_internal *vbi;
  vorbis_block *vb_local;
  
  pvVar1 = vb->internal;
  pvVar2 = vb->vd->backend_state;
  pvVar3 = vb->vd->vi;
  pvVar4 = pvVar3->codec_setup;
  dVar10 = rint(*(double *)((long)pvVar2 + 200));
  this_bits._4_4_ = (int)dVar10;
  lVar7 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10));
  min_target_bits = lVar7 * 8;
  if (vb->W == 0) {
    local_b8 = *(long *)((long)pvVar2 + 0xb0);
  }
  else {
    local_b8 = *(long *)((long)pvVar2 + 0xb0) * *(long *)((long)pvVar2 + 0xc0);
  }
  if (vb->W == 0) {
    local_c0 = *(long *)((long)pvVar2 + 0xb8);
  }
  else {
    local_c0 = *(long *)((long)pvVar2 + 0xb8) * *(long *)((long)pvVar2 + 0xc0);
  }
  iVar6 = (int)(*(long *)((long)pvVar4 + vb->W * 8) >> 1);
  lVar7 = (long)((double)*(long *)((long)pvVar4 + 0x1558) * *(double *)((long)pvVar4 + 0x1560));
  if (*(int *)((long)pvVar2 + 0x90) == 0) {
    if (*(long *)((long)pvVar2 + 0xd0) == 0) {
      *(vorbis_block **)((long)pvVar2 + 0xd0) = vb;
      vb_local._4_4_ = 0;
    }
    else {
      vb_local._4_4_ = -1;
    }
  }
  else {
    *(vorbis_block **)((long)pvVar2 + 0xd0) = vb;
    if (0 < *(long *)((long)pvVar2 + 0xa8)) {
      if (vb->W == 0) {
        local_c8 = *(long *)((long)pvVar2 + 0xa8);
      }
      else {
        local_c8 = *(long *)((long)pvVar2 + 0xa8) * *(long *)((long)pvVar2 + 0xc0);
      }
      dVar10 = 15.0 / *(double *)((long)pvVar4 + 0x1568);
      if (lVar7 < *(long *)((long)pvVar2 + 0x98) + (min_target_bits - local_c8)) {
        while( true ) {
          bVar5 = false;
          if ((0 < this_bits._4_4_) && (bVar5 = false, local_c8 < min_target_bits)) {
            bVar5 = lVar7 < *(long *)((long)pvVar2 + 0x98) + (min_target_bits - local_c8);
          }
          if (!bVar5) break;
          this_bits._4_4_ = this_bits._4_4_ + -1;
          lVar8 = oggpack_bytes(*(oggpack_buffer **)
                                 ((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10));
          min_target_bits = lVar8 << 3;
        }
      }
      else if (*(long *)((long)pvVar2 + 0x98) + (min_target_bits - local_c8) < lVar7) {
        while( true ) {
          bVar5 = false;
          if ((this_bits._4_4_ + 1 < 0xf) && (bVar5 = false, min_target_bits < local_c8)) {
            bVar5 = *(long *)((long)pvVar2 + 0x98) + (min_target_bits - local_c8) < lVar7;
          }
          if (!bVar5) break;
          this_bits._4_4_ = this_bits._4_4_ + 1;
          lVar8 = oggpack_bytes(*(oggpack_buffer **)
                                 ((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10));
          min_target_bits = lVar8 << 3;
        }
      }
      dVar11 = rint((double)this_bits._4_4_ - *(double *)((long)pvVar2 + 200));
      avg_target_bits = (long)((dVar11 / (double)iVar6) * (double)pvVar3->rate);
      if ((double)avg_target_bits < -dVar10) {
        avg_target_bits = (long)-dVar10;
      }
      if (dVar10 < (double)avg_target_bits) {
        avg_target_bits = (long)dVar10;
      }
      dVar10 = ((double)avg_target_bits / (double)pvVar3->rate) * (double)iVar6 +
               *(double *)((long)pvVar2 + 200);
      *(double *)((long)pvVar2 + 200) = dVar10;
      dVar10 = rint(dVar10);
      this_bits._4_4_ = (int)dVar10;
      lVar8 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10));
      min_target_bits = lVar8 << 3;
    }
    if ((0 < *(long *)((long)pvVar2 + 0xb0)) && (min_target_bits < local_b8)) {
      while ((*(long *)((long)pvVar2 + 0xa0) - (local_b8 - min_target_bits) < 0 &&
             (this_bits._4_4_ = this_bits._4_4_ + 1, this_bits._4_4_ < 0xf))) {
        lVar8 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10))
        ;
        min_target_bits = lVar8 << 3;
      }
    }
    if ((0 < *(long *)((long)pvVar2 + 0xb8)) && (local_c0 < min_target_bits)) {
      while ((*(long *)((long)pvVar4 + 0x1558) <
              *(long *)((long)pvVar2 + 0xa0) + (min_target_bits - local_c0) &&
             (this_bits._4_4_ = this_bits._4_4_ + -1, -1 < this_bits._4_4_))) {
        lVar8 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10))
        ;
        min_target_bits = lVar8 << 3;
      }
    }
    if (this_bits._4_4_ < 0) {
      lVar8 = (local_c0 + (*(long *)((long)pvVar4 + 0x1558) - *(long *)((long)pvVar2 + 0xa0))) / 8;
      *(undefined4 *)((long)pvVar2 + 0xd8) = 0;
      lVar9 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + 0x10));
      if (lVar8 < lVar9) {
        oggpack_writetrunc(*(oggpack_buffer **)((long)pvVar1 + 0x10),lVar8 << 3);
        lVar8 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + 0x10));
        min_target_bits = lVar8 << 3;
      }
    }
    else {
      lVar8 = *(long *)((long)pvVar2 + 0xa0);
      if (0xe < this_bits._4_4_) {
        this_bits._4_4_ = 0xe;
      }
      *(int *)((long)pvVar2 + 0xd8) = this_bits._4_4_;
      lVar9 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10));
      avg_target_bits_1 = ((local_b8 - lVar8) + 7) / 8 - lVar9;
      while (0 < avg_target_bits_1) {
        oggpack_write(*(oggpack_buffer **)((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10),0,8);
        avg_target_bits_1 = avg_target_bits_1 + -1;
      }
      lVar8 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)this_bits._4_4_ * 8 + 0x10));
      min_target_bits = lVar8 << 3;
    }
    if ((0 < *(long *)((long)pvVar2 + 0xb0)) || (0 < *(long *)((long)pvVar2 + 0xb8))) {
      if ((local_c0 < 1) || (min_target_bits <= local_c0)) {
        if ((local_b8 < 1) || (local_b8 <= min_target_bits)) {
          if (lVar7 < *(long *)((long)pvVar2 + 0xa0)) {
            if (local_c0 < 1) {
              *(long *)((long)pvVar2 + 0xa0) = lVar7;
            }
            else {
              *(long *)((long)pvVar2 + 0xa0) =
                   (min_target_bits - local_c0) + *(long *)((long)pvVar2 + 0xa0);
              if (*(long *)((long)pvVar2 + 0xa0) < lVar7) {
                *(long *)((long)pvVar2 + 0xa0) = lVar7;
              }
            }
          }
          else if (local_b8 < 1) {
            *(long *)((long)pvVar2 + 0xa0) = lVar7;
          }
          else {
            *(long *)((long)pvVar2 + 0xa0) =
                 (min_target_bits - local_b8) + *(long *)((long)pvVar2 + 0xa0);
            if (lVar7 < *(long *)((long)pvVar2 + 0xa0)) {
              *(long *)((long)pvVar2 + 0xa0) = lVar7;
            }
          }
        }
        else {
          *(long *)((long)pvVar2 + 0xa0) =
               (min_target_bits - local_b8) + *(long *)((long)pvVar2 + 0xa0);
        }
      }
      else {
        *(long *)((long)pvVar2 + 0xa0) =
             (min_target_bits - local_c0) + *(long *)((long)pvVar2 + 0xa0);
      }
    }
    if (0 < *(long *)((long)pvVar2 + 0xa8)) {
      if (vb->W == 0) {
        local_d8 = *(long *)((long)pvVar2 + 0xa8);
      }
      else {
        local_d8 = *(long *)((long)pvVar2 + 0xa8) * *(long *)((long)pvVar2 + 0xc0);
      }
      *(long *)((long)pvVar2 + 0x98) = (min_target_bits - local_d8) + *(long *)((long)pvVar2 + 0x98)
      ;
    }
    vb_local._4_4_ = 0;
  }
  return vb_local._4_4_;
}

Assistant:

int vorbis_bitrate_addblock(vorbis_block *vb){
  vorbis_block_internal *vbi=vb->internal;
  vorbis_dsp_state      *vd=vb->vd;
  private_state         *b=vd->backend_state;
  bitrate_manager_state *bm=&b->bms;
  vorbis_info           *vi=vd->vi;
  codec_setup_info      *ci=vi->codec_setup;
  bitrate_manager_info  *bi=&ci->bi;

  int  choice=rint(bm->avgfloat);
  long this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  long min_target_bits=(vb->W?bm->min_bitsper*bm->short_per_long:bm->min_bitsper);
  long max_target_bits=(vb->W?bm->max_bitsper*bm->short_per_long:bm->max_bitsper);
  int  samples=ci->blocksizes[vb->W]>>1;
  long desired_fill=bi->reservoir_bits*bi->reservoir_bias;
  if(!bm->managed){
    /* not a bitrate managed stream, but for API simplicity, we'll
       buffer the packet to keep the code path clean */

    if(bm->vb)return(-1); /* one has been submitted without
                             being claimed */
    bm->vb=vb;
    return(0);
  }

  bm->vb=vb;

  /* look ahead for avg floater */
  if(bm->avg_bitsper>0){
    double slew=0.;
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    double slewlimit= 15./bi->slew_damp;

    /* choosing a new floater:
       if we're over target, we slew down
       if we're under target, we slew up

       choose slew as follows: look through packetblobs of this frame
       and set slew as the first in the appropriate direction that
       gives us the slew we want.  This may mean no slew if delta is
       already favorable.

       Then limit slew to slew max */

    if(bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
      while(choice>0 && this_bits>avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
        choice--;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }else if(bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
      while(choice+1<PACKETBLOBS && this_bits<avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
        choice++;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }

    slew=rint(choice-bm->avgfloat)/samples*vi->rate;
    if(slew<-slewlimit)slew=-slewlimit;
    if(slew>slewlimit)slew=slewlimit;
    choice=rint(bm->avgfloat+= slew/vi->rate*samples);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  }



  /* enforce min(if used) on the current floater (if used) */
  if(bm->min_bitsper>0){
    /* do we need to force the bitrate up? */
    if(this_bits<min_target_bits){
      while(bm->minmax_reservoir-(min_target_bits-this_bits)<0){
        choice++;
        if(choice>=PACKETBLOBS)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* enforce max (if used) on the current floater (if used) */
  if(bm->max_bitsper>0){
    /* do we need to force the bitrate down? */
    if(this_bits>max_target_bits){
      while(bm->minmax_reservoir+(this_bits-max_target_bits)>bi->reservoir_bits){
        choice--;
        if(choice<0)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* Choice of packetblobs now made based on floater, and min/max
     requirements. Now boundary check extreme choices */

  if(choice<0){
    /* choosing a smaller packetblob is insufficient to trim bitrate.
       frame will need to be truncated */
    long maxsize=(max_target_bits+(bi->reservoir_bits-bm->minmax_reservoir))/8;
    bm->choice=choice=0;

    if(oggpack_bytes(vbi->packetblob[choice])>maxsize){

      oggpack_writetrunc(vbi->packetblob[choice],maxsize*8);
      this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
    }
  }else{
    long minsize=(min_target_bits-bm->minmax_reservoir+7)/8;
    if(choice>=PACKETBLOBS)
      choice=PACKETBLOBS-1;

    bm->choice=choice;

    /* prop up bitrate according to demand. pad this frame out with zeroes */
    minsize-=oggpack_bytes(vbi->packetblob[choice]);
    while(minsize-->0)oggpack_write(vbi->packetblob[choice],0,8);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;

  }

  /* now we have the final packet and the final packet size.  Update statistics */
  /* min and max reservoir */
  if(bm->min_bitsper>0 || bm->max_bitsper>0){

    if(max_target_bits>0 && this_bits>max_target_bits){
      bm->minmax_reservoir+=(this_bits-max_target_bits);
    }else if(min_target_bits>0 && this_bits<min_target_bits){
      bm->minmax_reservoir+=(this_bits-min_target_bits);
    }else{
      /* inbetween; we want to take reservoir toward but not past desired_fill */
      if(bm->minmax_reservoir>desired_fill){
        if(max_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-max_target_bits);
          if(bm->minmax_reservoir<desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }else{
        if(min_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-min_target_bits);
          if(bm->minmax_reservoir>desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }
    }
  }

  /* avg reservoir */
  if(bm->avg_bitsper>0){
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    bm->avg_reservoir+=this_bits-avg_target_bits;
  }

  return(0);
}